

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

String * __thiscall kj::_::CidrRange::toString(String *__return_storage_ptr__,CidrRange *this)

{
  kj *pkVar1;
  uint *in_R8;
  Fault f;
  char result [128];
  Fault local_b0;
  char local_a8 [16];
  kj local_98 [128];
  
  pkVar1 = (kj *)inet_ntop(this->family,this->bits,(char *)local_98,0x80);
  if (pkVar1 == local_98) {
    local_a8[0] = '/';
    str<char(&)[128],char,unsigned_int_const&>
              (__return_storage_ptr__,local_98,(char (*) [128])local_a8,(char *)&this->bitCount,
               in_R8);
    return __return_storage_ptr__;
  }
  local_b0.exception = (Exception *)0x0;
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  Debug::Fault::init(&local_b0,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                    );
  Debug::Fault::fatal(&local_b0);
}

Assistant:

String CidrRange::toString() const {
  char result[128];
  KJ_ASSERT(inet_ntop(family, (void*)bits, result, sizeof(result)) == result);
  return kj::str(result, '/', bitCount);
}